

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O0

PVG_FT_Error PVG_FT_Stroker_LineTo(PVG_FT_Stroker stroker,PVG_FT_Vector *to)

{
  PVG_FT_Error PVar1;
  PVG_FT_Angle start_angle;
  undefined1 local_60 [8];
  PVG_FT_Vector point;
  PVG_FT_Fixed line_length;
  PVG_FT_Int side;
  PVG_FT_Angle angle;
  PVG_FT_Vector delta;
  PVG_FT_StrokeBorder border;
  PVG_FT_Error error;
  PVG_FT_Vector *to_local;
  PVG_FT_Stroker stroker_local;
  
  border._4_4_ = 0;
  angle = to->x - (stroker->center).x;
  delta.x = to->y - (stroker->center).y;
  if ((angle != 0) || (delta.x != 0)) {
    point.y = PVG_FT_Vector_Length((PVG_FT_Vector *)&angle);
    start_angle = PVG_FT_Atan2(angle,delta.x);
    PVG_FT_Vector_From_Polar((PVG_FT_Vector *)&angle,stroker->radius,start_angle + 0x5a0000);
    if (stroker->first_point == '\0') {
      stroker->angle_out = start_angle;
      border._4_4_ = ft_stroker_process_corner(stroker,point.y);
    }
    else {
      border._4_4_ = ft_stroker_subpath_start(stroker,start_angle,point.y);
    }
    if (border._4_4_ == 0) {
      delta.y = (PVG_FT_Pos)stroker->borders;
      for (line_length._4_4_ = 1; -1 < line_length._4_4_; line_length._4_4_ = line_length._4_4_ + -1
          ) {
        local_60 = (undefined1  [8])(to->x + angle);
        point.x = to->y + delta.x;
        PVar1 = ft_stroke_border_lineto
                          ((PVG_FT_StrokeBorder)delta.y,(PVG_FT_Vector *)local_60,'\x01');
        if (PVar1 != 0) {
          return PVar1;
        }
        angle = -angle;
        delta.x = -delta.x;
        delta.y = delta.y + 0x28;
        border._4_4_ = 0;
      }
      stroker->angle_in = start_angle;
      (stroker->center).x = to->x;
      (stroker->center).y = to->y;
      stroker->line_length = point.y;
    }
  }
  return border._4_4_;
}

Assistant:

PVG_FT_Error PVG_FT_Stroker_LineTo(PVG_FT_Stroker stroker, PVG_FT_Vector* to)
{
    PVG_FT_Error        error = 0;
    PVG_FT_StrokeBorder border;
    PVG_FT_Vector       delta;
    PVG_FT_Angle        angle;
    PVG_FT_Int          side;
    PVG_FT_Fixed        line_length;

    delta.x = to->x - stroker->center.x;
    delta.y = to->y - stroker->center.y;

    /* a zero-length lineto is a no-op; avoid creating a spurious corner */
    if (delta.x == 0 && delta.y == 0) goto Exit;

    /* compute length of line */
    line_length = PVG_FT_Vector_Length(&delta);

    angle = PVG_FT_Atan2(delta.x, delta.y);
    PVG_FT_Vector_From_Polar(&delta, stroker->radius, angle + PVG_FT_ANGLE_PI2);

    /* process corner if necessary */
    if (stroker->first_point) {
        /* This is the first segment of a subpath.  We need to     */
        /* add a point to each border at their respective starting */
        /* point locations.                                        */
        error = ft_stroker_subpath_start(stroker, angle, line_length);
        if (error) goto Exit;
    } else {
        /* process the current corner */
        stroker->angle_out = angle;
        error = ft_stroker_process_corner(stroker, line_length);
        if (error) goto Exit;
    }

    /* now add a line segment to both the `inside' and `outside' paths */
    for (border = stroker->borders, side = 1; side >= 0; side--, border++) {
        PVG_FT_Vector point;

        point.x = to->x + delta.x;
        point.y = to->y + delta.y;

        /* the ends of lineto borders are movable */
        error = ft_stroke_border_lineto(border, &point, TRUE);
        if (error) goto Exit;

        delta.x = -delta.x;
        delta.y = -delta.y;
    }

    stroker->angle_in = angle;
    stroker->center = *to;
    stroker->line_length = line_length;

Exit:
    return error;
}